

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.cpp
# Opt level: O1

SRes crnlib::LzmaDec_DecodeToDic
               (CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  uint uVar2;
  uint uVar3;
  UInt32 UVar4;
  UInt16 *pUVar5;
  Byte *pBVar6;
  ELzmaDummy EVar7;
  int iVar8;
  ELzmaStatus EVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Byte *pBVar15;
  ELzmaStatus *pEVar16;
  SizeT inSize;
  bool bVar17;
  uint local_6c;
  Byte *local_48;
  
  inSize = *srcLen;
  *srcLen = 0;
  pEVar16 = status;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  buf = p->tempBuf;
  do {
    uVar2 = p->remainLen;
    if (uVar2 == 0x112) {
      UVar4 = p->code;
      if (UVar4 == 0) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
      }
      return (uint)(UVar4 != 0);
    }
    local_6c = (uint)pEVar16;
    if (p->needFlush == 0) {
LAB_00199e93:
      uVar13 = p->dicPos;
      if (uVar13 < dicLimit) {
LAB_00199ecb:
        if (p->needInitState != 0) {
          uVar2 = (p->prop).lp;
          uVar3 = (p->prop).lc;
          pUVar5 = p->probs;
          uVar12 = 0;
          do {
            pUVar5[uVar12] = 0x400;
            uVar12 = uVar12 + 1;
          } while ((0x300 << ((char)uVar2 + (char)uVar3 & 0x1fU)) + 0x736 != uVar12);
          p->reps[3] = 1;
          p->reps[1] = 1;
          p->reps[2] = 1;
          p->state = 0;
          p->reps[0] = 1;
          p->needInitState = 0;
        }
        uVar2 = p->tempBufSize;
        uVar12 = (ulong)uVar2;
        if (uVar12 == 0) {
          if (inSize < 0x14 || dicLimit <= uVar13) {
            EVar7 = LzmaDec_TryDummy(p,src,inSize);
            if (EVar7 == DUMMY_ERROR) {
              memcpy(buf,src,inSize);
              p->tempBufSize = (uint)inSize;
              *srcLen = *srcLen + inSize;
              pEVar16 = (ELzmaStatus *)0x0;
              EVar9 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_0019a11f:
              *status = EVar9;
              bVar17 = false;
              pBVar15 = local_48;
            }
            else {
              bVar17 = true;
              pBVar15 = src;
              if (uVar13 < dicLimit) {
                pEVar16 = (ELzmaStatus *)((ulong)pEVar16 & 0xffffffff);
              }
              else {
                pEVar16 = (ELzmaStatus *)((ulong)pEVar16 & 0xffffffff);
                if (EVar7 != DUMMY_MATCH) {
                  pEVar16 = (ELzmaStatus *)0x1;
                  EVar9 = LZMA_STATUS_NOT_FINISHED;
                  goto LAB_0019a11f;
                }
              }
            }
            if (bVar17) goto LAB_0019a12f;
            bVar17 = false;
          }
          else {
            pEVar16 = (ELzmaStatus *)((ulong)pEVar16 & 0xffffffff);
            pBVar15 = src + (inSize - 0x14);
LAB_0019a12f:
            p->buf = src;
            iVar10 = LzmaDec_DecodeReal2(p,dicLimit,pBVar15);
            if (iVar10 == 0) {
              pBVar6 = p->buf;
              lVar11 = (long)pBVar6 - (long)src;
              *srcLen = *srcLen + lVar11;
              inSize = inSize - lVar11;
              bVar17 = true;
              src = pBVar6;
            }
            else {
              pEVar16 = (ELzmaStatus *)0x1;
              bVar17 = false;
            }
          }
          local_48 = pBVar15;
          if (!bVar17) {
            bVar17 = false;
            goto LAB_0019a190;
          }
        }
        else {
          iVar10 = 0;
          bVar17 = uVar2 < 0x14;
          if (bVar17) {
            uVar14 = 0;
            if (inSize != 0) {
              uVar14 = 0;
              do {
                pBVar15 = src + uVar14;
                uVar14 = uVar14 + 1;
                p->tempBuf[uVar12] = *pBVar15;
                bVar17 = uVar12 < 0x13;
                if (!bVar17) break;
                uVar12 = uVar12 + 1;
              } while (uVar14 < inSize);
              iVar10 = (int)uVar14;
              uVar12 = (ulong)(uVar2 + iVar10);
            }
          }
          else {
            uVar14 = 0;
          }
          p->tempBufSize = (uint)uVar12;
          if ((bool)(uVar13 < dicLimit & (bVar17 ^ 1U))) {
LAB_0019a07f:
            p->buf = buf;
            iVar8 = LzmaDec_DecodeReal2(p,dicLimit,buf);
            bVar17 = iVar8 == 0;
            if (bVar17) {
              uVar13 = (ulong)((iVar10 - (uint)uVar12) + (*(int *)&p->buf - (int)buf));
              *srcLen = *srcLen + uVar13;
              src = src + uVar13;
              inSize = inSize - uVar13;
              p->tempBufSize = 0;
              pEVar16 = (ELzmaStatus *)(ulong)local_6c;
            }
            else {
              pEVar16 = (ELzmaStatus *)0x1;
            }
          }
          else {
            EVar7 = LzmaDec_TryDummy(p,buf,uVar12);
            if (EVar7 == DUMMY_ERROR) {
              *srcLen = *srcLen + uVar14;
              pEVar16 = (ELzmaStatus *)0x0;
              EVar9 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_0019a072:
              *status = EVar9;
              bVar17 = false;
            }
            else {
              bVar17 = true;
              if (uVar13 < dicLimit) {
                pEVar16 = (ELzmaStatus *)((ulong)pEVar16 & 0xffffffff);
              }
              else {
                pEVar16 = (ELzmaStatus *)((ulong)pEVar16 & 0xffffffff);
                if (EVar7 != DUMMY_MATCH) {
                  pEVar16 = (ELzmaStatus *)0x1;
                  EVar9 = LZMA_STATUS_NOT_FINISHED;
                  goto LAB_0019a072;
                }
              }
            }
            if (bVar17) {
              local_6c = (uint)pEVar16;
              goto LAB_0019a07f;
            }
            bVar17 = false;
          }
          if (!bVar17) goto LAB_0019a0e4;
        }
        bVar17 = true;
      }
      else {
        if ((uVar2 == 0) && (p->code == 0)) {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        }
        else {
          if (finishMode != LZMA_FINISH_ANY) {
            if (uVar2 != 0) {
              *status = LZMA_STATUS_NOT_FINISHED;
              goto LAB_00199ec0;
            }
            goto LAB_00199ecb;
          }
          *status = LZMA_STATUS_NOT_FINISHED;
        }
LAB_0019a0f1:
        bVar17 = false;
        pEVar16 = (ELzmaStatus *)0x0;
      }
    }
    else {
      if (inSize != 0) {
        uVar3 = p->tempBufSize;
        uVar12 = 5;
        uVar13 = (ulong)uVar3;
        if (5 < uVar3) {
          uVar12 = (ulong)uVar3;
        }
        do {
          if (uVar12 == uVar13) break;
          BVar1 = *src;
          p->tempBufSize = (uint)(uVar13 + 1);
          p->tempBuf[uVar13] = BVar1;
          *srcLen = *srcLen + 1;
          src = src + 1;
          inSize = inSize - 1;
          uVar13 = uVar13 + 1;
        } while (inSize != 0);
      }
      if (p->tempBufSize < 5) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        goto LAB_0019a0f1;
      }
      if (p->tempBuf[0] == '\0') {
        uVar3 = *(uint *)(p->tempBuf + 1);
        p->code = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        p->range = 0xffffffff;
        p->needFlush = 0;
        p->tempBufSize = 0;
        goto LAB_00199e93;
      }
LAB_00199ec0:
      pEVar16 = (ELzmaStatus *)0x1;
LAB_0019a0e4:
      bVar17 = false;
    }
LAB_0019a190:
    if (!bVar17) {
      return (SRes)pEVar16;
    }
  } while( true );
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec* p, SizeT dicLimit, const Byte* src, SizeT* srcLen,
                         ELzmaFinishMode finishMode, ELzmaStatus* status) {
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);

  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart) {
    int checkEndMarkNow;

    if (p->needFlush != 0) {
      for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
        p->tempBuf[p->tempBufSize++] = *src++;
      if (p->tempBufSize < RC_INIT_SIZE) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      if (p->tempBuf[0] != 0)
        return SZ_ERROR_DATA;

      LzmaDec_InitRc(p, p->tempBuf);
      p->tempBufSize = 0;
    }

    checkEndMarkNow = 0;
    if (p->dicPos >= dicLimit) {
      if (p->remainLen == 0 && p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return SZ_OK;
      }
      if (finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_OK;
      }
      if (p->remainLen != 0) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_ERROR_DATA;
      }
      checkEndMarkNow = 1;
    }

    if (p->needInitState)
      LzmaDec_InitStateReal(p);

    if (p->tempBufSize == 0) {
      SizeT processed;
      const Byte* bufLimit;
      if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, src, inSize);
        if (dummyRes == DUMMY_ERROR) {
          memcpy(p->tempBuf, src, inSize);
          p->tempBufSize = (unsigned)inSize;
          (*srcLen) += inSize;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        bufLimit = src;
      } else
        bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
      p->buf = src;
      if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
        return SZ_ERROR_DATA;
      processed = (SizeT)(p->buf - src);
      (*srcLen) += processed;
      src += processed;
      inSize -= processed;
    } else {
      unsigned rem = p->tempBufSize, lookAhead = 0;
      while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
        p->tempBuf[rem++] = src[lookAhead++];
      p->tempBufSize = rem;
      if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
        if (dummyRes == DUMMY_ERROR) {
          (*srcLen) += lookAhead;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
      }
      p->buf = p->tempBuf;
      if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
        return SZ_ERROR_DATA;
      lookAhead -= (rem - (unsigned)(p->buf - p->tempBuf));
      (*srcLen) += lookAhead;
      src += lookAhead;
      inSize -= lookAhead;
      p->tempBufSize = 0;
    }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}